

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O3

size_t cilkos_validate_stack_size(size_t specified_stack_size)

{
  size_t sVar1;
  
  if (specified_stack_size == 0) {
    return 0x100000;
  }
  sVar1 = 0x4000;
  if ((0x4000 < specified_stack_size) &&
     (sVar1 = specified_stack_size, (specified_stack_size & 0xfff) != 0)) {
    sVar1 = (specified_stack_size & 0xfffffffffffff000) + 0x1000;
  }
  return sVar1;
}

Assistant:

size_t cilkos_validate_stack_size(size_t specified_stack_size) {
    // Convert any negative value to the default.
    if (specified_stack_size == 0) {
        CILK_ASSERT((CILK_DEFAULT_STACK_SIZE % PAGE) == 0);
        return CILK_DEFAULT_STACK_SIZE;
    }
    // Round values in between 0 and CILK_MIN_STACK_SIZE up to
    // CILK_MIN_STACK_SIZE.
    if (specified_stack_size <= CILK_MIN_STACK_SIZE) {
        return CILK_MIN_STACK_SIZE;
    }
    if ((specified_stack_size % PAGE) > 0) {
        // Round the user's stack size value up to nearest page boundary.
        return (PAGE * (1 + specified_stack_size / PAGE));
    }
    return specified_stack_size;
}